

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O2

void Dumper::dumpBBlockEdges(RWBBlock *block)

{
  long lVar1;
  RWBBlock *pRVar2;
  long lVar3;
  
  pRVar2 = block + 0x38;
  lVar1 = 0;
  while (lVar3 = lVar1, pRVar2 = *(RWBBlock **)pRVar2, pRVar2 != block + 0x38) {
    lVar1 = *(long *)(pRVar2 + 0x10);
    if (lVar3 != 0) {
      printf("\tNODE%p->NODE%p [constraint=true]\n",lVar3,lVar1);
    }
  }
  putchar(10);
  return;
}

Assistant:

static void dumpBBlockEdges(RWBBlock *block) {
        // dump CFG edges between nodes in one block
        RWNode *last = nullptr;
        for (RWNode *node : block->getNodes()) {
            if (last) { // successor edge
                printf("\tNODE%p->NODE%p [constraint=true]\n",
                       static_cast<void *>(last), static_cast<void *>(node));
            }
            last = node;
        }
        putchar('\n');
    }